

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedback::CaptureGeometryInterleaved::fetchLimits(CaptureGeometryInterleaved *this)

{
  deUint32 dVar1;
  long lVar2;
  undefined4 *puVar3;
  int iVar4;
  GLint max_geometry_total_components;
  int local_1c;
  
  lVar2 = (**(code **)(**(long **)(*(long *)(&this->field_0x78 +
                                            (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 8) +
                      0x18))();
  (**(code **)(lVar2 + 0x868))
            (0x8c8a,&this->field_0x98 + (long)this->_vptr_CaptureGeometryInterleaved[-3]);
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"glGetIntegerv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xbb3);
  if (*(int *)(&this->field_0x98 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) != 0) {
    local_1c = 0;
    (**(code **)(lVar2 + 0x868))(0x8de1,&local_1c);
    dVar1 = (**(code **)(lVar2 + 0x800))();
    glu::checkError(dVar1,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xbbe);
    if (local_1c != 0) {
      if (local_1c <
          *(int *)(&this->field_0x98 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) * 4) {
        iVar4 = local_1c + 3;
        if (-1 < local_1c) {
          iVar4 = local_1c;
        }
        *(int *)(&this->field_0x98 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) = iVar4 >> 2;
      }
      return;
    }
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&int::typeinfo,0);
}

Assistant:

void gl3cts::TransformFeedback::CaptureGeometryInterleaved::fetchLimits(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching limits. */
	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS, &m_max_transform_feedback_components);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (m_max_transform_feedback_components == 0)
	{
		throw 0;
	}

	glw::GLint max_geometry_total_components = 0;

	gl.getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &max_geometry_total_components);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (max_geometry_total_components == 0)
	{
		throw 0;
	}

	if (m_max_transform_feedback_components * 4 > max_geometry_total_components)
	{
		m_max_transform_feedback_components = max_geometry_total_components / 4;
	}
}